

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

void Curl_hostcache_clean(Curl_easy *data,Curl_hash *hash)

{
  Curl_hash *hash_local;
  Curl_easy *data_local;
  
  if ((data != (Curl_easy *)0x0) && (data->share != (Curl_share *)0x0)) {
    Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
  }
  Curl_hash_clean(hash);
  if ((data != (Curl_easy *)0x0) && (data->share != (Curl_share *)0x0)) {
    Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
  }
  return;
}

Assistant:

void Curl_hostcache_clean(struct Curl_easy *data,
                          struct Curl_hash *hash)
{
  if(data && data->share)
    Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

  Curl_hash_clean(hash);

  if(data && data->share)
    Curl_share_unlock(data, CURL_LOCK_DATA_DNS);
}